

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> __thiscall
wabt::
MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSourceBuffer,std::default_delete<wabt::LexerSourceBuffer>>,wabt::string_view&>
          (wabt *this,
          unique_ptr<wabt::LexerSourceBuffer,_std::default_delete<wabt::LexerSourceBuffer>_> *args,
          string_view *args_1)

{
  WastLexer *this_00;
  _Head_base<0UL,_wabt::LexerSourceBuffer_*,_false> local_30;
  
  this_00 = (WastLexer *)operator_new(0x78);
  local_30._M_head_impl =
       (args->_M_t).
       super___uniq_ptr_impl<wabt::LexerSourceBuffer,_std::default_delete<wabt::LexerSourceBuffer>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSourceBuffer_*,_std::default_delete<wabt::LexerSourceBuffer>_>
       .super__Head_base<0UL,_wabt::LexerSourceBuffer_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<wabt::LexerSourceBuffer,_std::default_delete<wabt::LexerSourceBuffer>_>._M_t
  .super__Tuple_impl<0UL,_wabt::LexerSourceBuffer_*,_std::default_delete<wabt::LexerSourceBuffer>_>.
  super__Head_base<0UL,_wabt::LexerSourceBuffer_*,_false>._M_head_impl = (LexerSourceBuffer *)0x0;
  WastLexer::WastLexer
            (this_00,(unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)
                     &local_30,*args_1);
  *(WastLexer **)this = this_00;
  if (local_30._M_head_impl != (LexerSourceBuffer *)0x0) {
    (*((local_30._M_head_impl)->super_LexerSource)._vptr_LexerSource[1])();
  }
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}